

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

string_type * __thiscall
booster::locale::basic_format<char>::str_abi_cxx11_
          (string_type *__return_storage_ptr__,basic_format<char> *this,locale *loc)

{
  size_t in_RCX;
  void *__buf;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  locale local_1a0 [8];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ios::imbue(local_1a0);
  std::locale::~locale(local_1a0);
  write(this,(int)local_198,__buf,in_RCX);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string_type str(std::locale const &loc = std::locale()) const
            {
                std::basic_ostringstream<CharType> buffer;
                buffer.imbue(loc);
                write(buffer);
                return buffer.str();
            }